

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O1

bool checkSingleParameterArgumentPreconditions
               (string *argument,ParsedArguments *parsedArguments,string *errorMsg)

{
  pointer pcVar1;
  const_iterator cVar2;
  long *plVar3;
  size_type *psVar4;
  size_type *local_58;
  long local_50;
  size_type local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parsedArguments->_M_t,argument);
  if ((_Rb_tree_header *)cVar2._M_node == &(parsedArguments->_M_t)._M_impl.super__Rb_tree_header) {
    return true;
  }
  if (*(_Base_ptr *)(cVar2._M_node + 2) == cVar2._M_node[2]._M_parent) {
    pcVar1 = (argument->_M_dataplus)._M_p;
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + argument->_M_string_length);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::operator=((string *)errorMsg,(string *)&local_58);
    local_38.field_2._M_allocated_capacity = local_48;
    local_38._M_dataplus._M_p = (pointer)local_58;
    if (local_58 == &local_48) {
      return false;
    }
  }
  else {
    if ((ulong)((long)cVar2._M_node[2]._M_parent - (long)*(_Base_ptr *)(cVar2._M_node + 2)) < 0x21)
    {
      return true;
    }
    std::operator+(&local_38,"too many arguments passed to ",argument);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      local_48 = *psVar4;
      lStack_40 = plVar3[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *psVar4;
      local_58 = (size_type *)*plVar3;
    }
    local_50 = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)errorMsg,(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return false;
    }
  }
  operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

static bool checkSingleParameterArgumentPreconditions(
  const std::string& argument, const ParsedArguments& parsedArguments,
  std::string& errorMsg)
{
  auto foundArgument = parsedArguments.find(argument);
  if (foundArgument != parsedArguments.end()) {
    const std::vector<std::string>& optionArguments = foundArgument->second;

    if (optionArguments.empty()) {
      errorMsg = argument + " argument given without an argument.";
      return false;
    }
    if (optionArguments.size() > 1) {
      errorMsg = "too many arguments passed to " + argument + ".";
      return false;
    }
  }

  return true;
}